

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase135::run(TestCase135 *this)

{
  UnwindDetector *this_00;
  bool bVar1;
  undefined4 *puVar2;
  Type *func;
  Type *func_00;
  Type *func_01;
  Type *func_02;
  bool _kj_shouldLog_7;
  DebugExpression<bool_&> _kjCondition_7;
  bool _kj_shouldLog_6;
  bool local_f6;
  DebugExpression<bool> _kjCondition_6;
  int anon_var_4;
  bool _kj_shouldLog_5;
  DebugExpression<bool> _kjCondition_5;
  bool _kj_shouldLog_4;
  undefined1 *puStack_f0;
  DebugExpression<bool> _kjCondition_4;
  undefined1 local_e0 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_exception_test_c__:155:5)>
  _kjDefer155;
  undefined1 *puStack_c0;
  UnwindDetector _kjUnwindDetector155;
  undefined1 local_b0 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_exception_test_c__:154:5)>
  _kjDefer154;
  UnwindDetector _kjUnwindDetector154;
  bool _kj_shouldLog_3;
  DebugExpression<bool> _kjCondition_3;
  bool _kj_shouldLog_2;
  DebugExpression<bool_&> _kjCondition_2;
  bool _kj_shouldLog_1;
  DebugExpression<bool> _kjCondition_1;
  bool _kj_shouldLog;
  UnwindDetector *pUStack_80;
  DebugExpression<bool> _kjCondition;
  undefined1 local_70 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_exception_test_c__:141:5)>
  _kjDefer141;
  UnwindDetector local_44;
  UnwindDetector *pUStack_40;
  UnwindDetector _kjUnwindDetector141;
  undefined1 local_30 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_exception_test_c__:140:5)>
  _kjDefer140;
  UnwindDetector _kjUnwindDetector140;
  bool failure;
  bool success;
  TestCase135 *this_local;
  
  _kjDefer140.maybeFunc.ptr.field_1._15_1_ = 0;
  _kjDefer140.maybeFunc.ptr.field_1._14_1_ = 0;
  this_00 = (UnwindDetector *)((long)&_kjDefer140.maybeFunc.ptr.field_1 + 8);
  UnwindDetector::UnwindDetector(this_00);
  pUStack_40 = this_00;
  defer<kj::_::(anonymous_namespace)::TestCase135::run()::__0>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_exception_test_c__:140:5)>
              *)local_30,(kj *)&stack0xffffffffffffffc0,func);
  UnwindDetector::UnwindDetector(&local_44);
  pUStack_80 = &local_44;
  defer<kj::_::(anonymous_namespace)::TestCase135::run()::__1>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_exception_test_c__:141:5)>
              *)local_70,(kj *)&stack0xffffffffffffff80,func_00);
  _kjCondition_2.value._6_1_ = ~_kjDefer140.maybeFunc.ptr.field_1._15_1_ & 1;
  _kjCondition_2.value._7_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&_kjCondition_2.value + 6)
                 );
  bVar1 = _::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&_kjCondition_2.value + 7));
  if (!bVar1) {
    _kjCondition_2.value._5_1_ = Debug::shouldLog(ERROR);
    while ((bool)_kjCondition_2.value._5_1_ != false) {
      Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x8f,ERROR,"\"failed: expected \" \"!(success)\", _kjCondition",
                 (char (*) [28])"failed: expected !(success)",
                 (DebugExpression<bool> *)((long)&_kjCondition_2.value + 7));
      _kjCondition_2.value._5_1_ = false;
    }
  }
  _kjCondition_2.value._3_1_ = ~_kjDefer140.maybeFunc.ptr.field_1._14_1_ & 1;
  _kjCondition_2.value._4_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&_kjCondition_2.value + 3)
                 );
  bVar1 = _::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&_kjCondition_2.value + 4));
  if (!bVar1) {
    _kjCondition_2.value._2_1_ = Debug::shouldLog(ERROR);
    while ((bool)_kjCondition_2.value._2_1_ != false) {
      Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x90,ERROR,"\"failed: expected \" \"!(failure)\", _kjCondition",
                 (char (*) [28])"failed: expected !(failure)",
                 (DebugExpression<bool> *)((long)&_kjCondition_2.value + 4));
      _kjCondition_2.value._2_1_ = false;
    }
  }
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++:141:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_exception_test_c__:141:5)>
               *)local_70);
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++:140:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_exception_test_c__:140:5)>
               *)local_30);
  __kjUnwindDetector154 =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                  (bool *)((long)&_kjDefer140.maybeFunc.ptr.field_1 + 0xf));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kjUnwindDetector154);
  if (!bVar1) {
    _kjDefer154.maybeFunc.ptr.field_1._15_1_ = Debug::shouldLog(ERROR);
    while (_kjDefer154.maybeFunc.ptr.field_1._15_1_ != '\0') {
      Debug::log<char_const(&)[25],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x93,ERROR,"\"failed: expected \" \"success\", _kjCondition",
                 (char (*) [25])"failed: expected success",
                 (DebugExpression<bool_&> *)&_kjUnwindDetector154);
      _kjDefer154.maybeFunc.ptr.field_1._15_1_ = 0;
    }
  }
  _kjDefer154.maybeFunc.ptr.field_1._13_1_ = (_kjDefer140.maybeFunc.ptr.field_1._14_1_ ^ 0xff) & 1;
  _kjDefer154.maybeFunc.ptr.field_1._14_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                  (bool *)((long)&_kjDefer154.maybeFunc.ptr.field_1 + 0xd));
  bVar1 = _::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&_kjDefer154.maybeFunc.ptr.field_1 + 0xe));
  if (!bVar1) {
    _kjDefer154.maybeFunc.ptr.field_1._12_1_ = Debug::shouldLog(ERROR);
    while (_kjDefer154.maybeFunc.ptr.field_1._12_1_ != '\0') {
      Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x94,ERROR,"\"failed: expected \" \"!(failure)\", _kjCondition",
                 (char (*) [28])"failed: expected !(failure)",
                 (DebugExpression<bool> *)((long)&_kjDefer154.maybeFunc.ptr.field_1 + 0xe));
      _kjDefer154.maybeFunc.ptr.field_1._12_1_ = 0;
    }
  }
  _kjDefer140.maybeFunc.ptr.field_1._15_1_ = 0;
  _kjDefer140.maybeFunc.ptr.field_1._14_1_ = 0;
  UnwindDetector::UnwindDetector((UnwindDetector *)((long)&_kjDefer154.maybeFunc.ptr.field_1 + 8));
  puStack_c0 = (undefined1 *)((long)&_kjDefer154.maybeFunc.ptr.field_1 + 8);
  defer<kj::_::(anonymous_namespace)::TestCase135::run()::__2>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_exception_test_c__:154:5)>
              *)local_b0,(kj *)&stack0xffffffffffffff40,func_01);
  UnwindDetector::UnwindDetector((UnwindDetector *)((long)&_kjDefer155.maybeFunc.ptr.field_1 + 0xc))
  ;
  puStack_f0 = (undefined1 *)((long)&_kjDefer155.maybeFunc.ptr.field_1 + 0xc);
  defer<kj::_::(anonymous_namespace)::TestCase135::run()::__3>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_exception_test_c__:155:5)>
              *)local_e0,(kj *)&stack0xffffffffffffff10,func_02);
  anon_var_4._2_1_ = ~_kjDefer140.maybeFunc.ptr.field_1._15_1_ & 1;
  anon_var_4._3_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&anon_var_4 + 2));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&anon_var_4 + 3));
  if (!bVar1) {
    anon_var_4._1_1_ = Debug::shouldLog(ERROR);
    while ((bool)anon_var_4._1_1_ != false) {
      Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x9d,ERROR,"\"failed: expected \" \"!(success)\", _kjCondition",
                 (char (*) [28])"failed: expected !(success)",
                 (DebugExpression<bool> *)((long)&anon_var_4 + 3));
      anon_var_4._1_1_ = false;
    }
  }
  _kjCondition_6.value = (bool)(~_kjDefer140.maybeFunc.ptr.field_1._14_1_ & 1);
  anon_var_4._0_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,&_kjCondition_6.value);
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&anon_var_4);
  if (!bVar1) {
    local_f6 = Debug::shouldLog(ERROR);
    while (local_f6 != false) {
      Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x9e,ERROR,"\"failed: expected \" \"!(failure)\", _kjCondition",
                 (char (*) [28])"failed: expected !(failure)",(DebugExpression<bool> *)&anon_var_4);
      local_f6 = false;
    }
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 1;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

TEST(Exception, ScopeSuccessFail) {
  bool success = false;
  bool failure = false;

  {
    KJ_ON_SCOPE_SUCCESS(success = true);
    KJ_ON_SCOPE_FAILURE(failure = true);

    EXPECT_FALSE(success);
    EXPECT_FALSE(failure);
  }

  EXPECT_TRUE(success);
  EXPECT_FALSE(failure);

  success = false;
  failure = false;

  try {
    KJ_ON_SCOPE_SUCCESS(success = true);
    KJ_ON_SCOPE_FAILURE(failure = true);

    EXPECT_FALSE(success);
    EXPECT_FALSE(failure);

    throw 1;
  } catch (int) {}

  EXPECT_FALSE(success);
  EXPECT_TRUE(failure);
}